

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_Grp14.c
# Opt level: O0

void G14_(PDISASM pMyDisasm)

{
  int iVar1;
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\0') {
      failDecode(pMyDisasm);
    }
    else if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      iVar1 = Security(2,pMyDisasm);
      if (iVar1 != 0) {
        (pMyDisasm->Reserved_).REGOPCODE =
             (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 3 & 7;
        if ((pMyDisasm->Reserved_).REGOPCODE == 6) {
          (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
          if (((pMyDisasm->Reserved_).EVEX.state == '\x01') || ((pMyDisasm->Reserved_).MOD_ == 3)) {
            strcpy((pMyDisasm->Instruction).Mnemonic,"vpsllq");
            (pMyDisasm->Instruction).Category = 0x120000;
            if ((pMyDisasm->Reserved_).VEX.L == '\0') {
              (pMyDisasm->Reserved_).Register_ = 4;
              (pMyDisasm->Reserved_).MemDecoration = 0x6d;
            }
            else if ((pMyDisasm->Reserved_).VEX.L == '\x01') {
              (pMyDisasm->Reserved_).Register_ = 8;
              (pMyDisasm->Reserved_).MemDecoration = 0x6e;
            }
            else if ((pMyDisasm->Reserved_).EVEX.LL == '\x02') {
              (pMyDisasm->Reserved_).Register_ = 0x10;
              (pMyDisasm->Reserved_).MemDecoration = 0x72;
            }
            fillRegister((((pMyDisasm->Reserved_).VEX.vvvv ^ 0xffffffff) & 0xf) +
                         (uint)(pMyDisasm->Reserved_).EVEX.V * 0x10,&pMyDisasm->Operand1,pMyDisasm);
            decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
            (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 2;
            getImmediat8(&pMyDisasm->Operand3,pMyDisasm);
          }
          else {
            failDecode(pMyDisasm);
          }
        }
        else if ((pMyDisasm->Reserved_).REGOPCODE == 7) {
          iVar1 = Security(2,pMyDisasm);
          if (iVar1 != 0) {
            (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6
            ;
            if (((pMyDisasm->Reserved_).EVEX.state == '\x01') || ((pMyDisasm->Reserved_).MOD_ == 3))
            {
              strcpy((pMyDisasm->Instruction).Mnemonic,"vpslldq");
              (pMyDisasm->Instruction).Category = 0x120000;
              if ((pMyDisasm->Reserved_).VEX.L == '\0') {
                (pMyDisasm->Reserved_).Register_ = 4;
                (pMyDisasm->Reserved_).MemDecoration = 0x6d;
              }
              else if ((pMyDisasm->Reserved_).VEX.L == '\x01') {
                (pMyDisasm->Reserved_).Register_ = 8;
                (pMyDisasm->Reserved_).MemDecoration = 0x6e;
              }
              else if ((pMyDisasm->Reserved_).EVEX.LL == '\x02') {
                (pMyDisasm->Reserved_).Register_ = 0x10;
                (pMyDisasm->Reserved_).MemDecoration = 0x72;
              }
              fillRegister((((pMyDisasm->Reserved_).VEX.vvvv ^ 0xffffffff) & 0xf) +
                           (uint)(pMyDisasm->Reserved_).EVEX.V * 0x10,&pMyDisasm->Operand1,pMyDisasm
                          );
              decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
              (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 2;
              getImmediat8(&pMyDisasm->Operand3,pMyDisasm);
            }
            else {
              failDecode(pMyDisasm);
            }
          }
        }
        else {
          failDecode(pMyDisasm);
        }
      }
    }
    else if ((pMyDisasm->Reserved_).VEX.pp == '\x02') {
      failDecode(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    iVar1 = Security(2,pMyDisasm);
    if (iVar1 != 0) {
      (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
      if ((pMyDisasm->Reserved_).MOD_ == 3) {
        (pMyDisasm->Reserved_).REGOPCODE =
             (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 3 & 7;
        if ((pMyDisasm->Reserved_).REGOPCODE == 2) {
          if ((pMyDisasm->Reserved_).OperandSize == 0x10) {
            (pMyDisasm->Instruction).Category = 0x40004;
            (pMyDisasm->Reserved_).MemDecoration = 8;
            (pMyDisasm->Reserved_).Register_ = 4;
          }
          else {
            (pMyDisasm->Instruction).Category = 0x30004;
            (pMyDisasm->Reserved_).MemDecoration = 4;
            (pMyDisasm->Reserved_).Register_ = 2;
          }
          decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
          (pMyDisasm->Reserved_).Register_ = 0;
          strcpy((pMyDisasm->Instruction).Mnemonic,"psrlq");
          (pMyDisasm->Reserved_).EIP_ =
               (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
          getImmediat8(&pMyDisasm->Operand2,pMyDisasm);
        }
        else if ((pMyDisasm->Reserved_).REGOPCODE == 3) {
          if ((pMyDisasm->Reserved_).OperandSize == 0x10) {
            (pMyDisasm->Instruction).Category = 0x40004;
            (pMyDisasm->Reserved_).MemDecoration = 8;
            (pMyDisasm->Reserved_).Register_ = 4;
            decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
            (pMyDisasm->Reserved_).Register_ = 0;
            strcpy((pMyDisasm->Instruction).Mnemonic,"psrldq");
            (pMyDisasm->Reserved_).EIP_ =
                 (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
            getImmediat8(&pMyDisasm->Operand2,pMyDisasm);
          }
          else {
            failDecode(pMyDisasm);
          }
        }
        else if ((pMyDisasm->Reserved_).REGOPCODE == 6) {
          if ((pMyDisasm->Reserved_).OperandSize == 0x10) {
            (pMyDisasm->Instruction).Category = 0x40004;
            (pMyDisasm->Reserved_).MemDecoration = 8;
            (pMyDisasm->Reserved_).Register_ = 4;
          }
          else {
            (pMyDisasm->Instruction).Category = 0x30004;
            (pMyDisasm->Reserved_).MemDecoration = 4;
            (pMyDisasm->Reserved_).Register_ = 2;
          }
          decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
          (pMyDisasm->Reserved_).Register_ = 0;
          strcpy((pMyDisasm->Instruction).Mnemonic,"psllq");
          (pMyDisasm->Reserved_).EIP_ =
               (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
          getImmediat8(&pMyDisasm->Operand2,pMyDisasm);
        }
        else if ((pMyDisasm->Reserved_).REGOPCODE == 7) {
          if ((pMyDisasm->Reserved_).OperandSize == 0x10) {
            (pMyDisasm->Instruction).Category = 0x40004;
            (pMyDisasm->Reserved_).MemDecoration = 8;
            (pMyDisasm->Reserved_).ImmediatSize = 8;
            (pMyDisasm->Reserved_).Register_ = 4;
            decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
            (pMyDisasm->Reserved_).Register_ = 0;
            strcpy((pMyDisasm->Instruction).Mnemonic,"pslldq");
            (pMyDisasm->Reserved_).EIP_ =
                 (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
            getImmediat8(&pMyDisasm->Operand2,pMyDisasm);
          }
          else {
            failDecode(pMyDisasm);
          }
        }
        else {
          failDecode(pMyDisasm);
        }
      }
      else {
        failDecode(pMyDisasm);
      }
    }
  }
  return;
}

Assistant:

void __bea_callspec__ G14_(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 0) {
      failDecode(pMyDisasm);
    }
    else if (GV.VEX.pp == 1) {
      if (!Security(2, pMyDisasm)) return;
      GV.REGOPCODE = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0x7;
      if (GV.REGOPCODE == 6) {
        GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
        if (
          (GV.EVEX.state != InUsePrefix) &&
          (GV.MOD_!= 0x3)) {
          failDecode(pMyDisasm);
          return;
        }
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpsllq");
        #endif
        pMyDisasm->Instruction.Category = AVX2_INSTRUCTION;
        if (GV.VEX.L == 0) {
          GV.Register_ = SSE_REG;
          GV.MemDecoration = Arg2_m128_xmm;
        }
        else if (GV.VEX.L == 1) {
          GV.Register_ = AVX_REG;
          GV.MemDecoration = Arg2_m256_ymm;
        }
        else if (GV.EVEX.LL == 2) {
          GV.Register_ = AVX512_REG;
          GV.MemDecoration = Arg2_m512_zmm;
        }
        fillRegister((~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V, &pMyDisasm->Operand1, pMyDisasm);
        decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        GV.EIP_+=2;
        getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
      }
      else if (GV.REGOPCODE == 7) {
        if (!Security(2, pMyDisasm)) return;
        GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
        if (
          (GV.EVEX.state != InUsePrefix) &&
          (GV.MOD_!= 0x3)) {
          failDecode(pMyDisasm);
          return;
        }
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpslldq");
        #endif
        pMyDisasm->Instruction.Category = AVX2_INSTRUCTION;
        if (GV.VEX.L == 0) {
          GV.Register_ = SSE_REG;
          GV.MemDecoration = Arg2_m128_xmm;
        }
        else if (GV.VEX.L == 1) {
          GV.Register_ = AVX_REG;
          GV.MemDecoration = Arg2_m256_ymm;
        }
        else if (GV.EVEX.LL == 2) {
          GV.Register_ = AVX512_REG;
          GV.MemDecoration = Arg2_m512_zmm;
        }
        fillRegister((~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V, &pMyDisasm->Operand1, pMyDisasm);
        decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        GV.EIP_+=2;
        getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else if (GV.VEX.pp == 2) {
      failDecode(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    if (!Security(2, pMyDisasm)) return;
    GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
    if (GV.MOD_!= 0x3) {
      failDecode(pMyDisasm);
      return;
    }
    GV.REGOPCODE = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0x7;
    if (GV.REGOPCODE == 2) {
      if (GV.OperandSize == 16) {
        pMyDisasm->Instruction.Category = SSE_INSTRUCTION+SHIFT_ROTATE;
        GV.MemDecoration = Arg1dqword;
        GV.Register_ = SSE_REG;
      }
      else {
        pMyDisasm->Instruction.Category = MMX_INSTRUCTION+SHIFT_ROTATE;
        GV.MemDecoration = Arg1qword;
        GV.Register_ = MMX_REG;
      }
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      GV.Register_ = 0;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "psrlq");
      #endif
      GV.EIP_ += GV.DECALAGE_EIP+2;
      getImmediat8(&pMyDisasm->Operand2, pMyDisasm);
    }
    else if (GV.REGOPCODE == 3) {
      if (GV.OperandSize == 16) {
        pMyDisasm->Instruction.Category = SSE_INSTRUCTION+SHIFT_ROTATE;
        GV.MemDecoration = Arg1dqword;
        GV.Register_ = SSE_REG;
        decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
        GV.Register_ = 0;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "psrldq");
        #endif
        GV.EIP_ += GV.DECALAGE_EIP+2;
        getImmediat8(&pMyDisasm->Operand2, pMyDisasm);
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else if (GV.REGOPCODE == 6) {
      if (GV.OperandSize == 16) {
        pMyDisasm->Instruction.Category = SSE_INSTRUCTION+SHIFT_ROTATE;
        GV.MemDecoration = Arg1dqword;
        GV.Register_ = SSE_REG;
      }
      else {
        pMyDisasm->Instruction.Category = MMX_INSTRUCTION+SHIFT_ROTATE;
        GV.MemDecoration = Arg1qword;
        GV.Register_ = MMX_REG;
      }
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      GV.Register_ = 0;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "psllq");
      #endif
      GV.EIP_ += GV.DECALAGE_EIP+2;
      getImmediat8(&pMyDisasm->Operand2, pMyDisasm);
    }
    else if (GV.REGOPCODE == 7) {
      if (GV.OperandSize == 16) {
        pMyDisasm->Instruction.Category = SSE_INSTRUCTION+SHIFT_ROTATE;
        GV.MemDecoration = Arg1dqword;
        GV.ImmediatSize = 8;
        GV.Register_ = SSE_REG;
        decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
        GV.Register_ = 0;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pslldq");
        #endif
        GV.EIP_ += GV.DECALAGE_EIP+2;
        getImmediat8(&pMyDisasm->Operand2, pMyDisasm);
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
}